

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O0

bool __thiscall
Memory::PreReservedVirtualAllocWrapper::IsInRange
          (PreReservedVirtualAllocWrapper *this,void *address)

{
  code *pcVar1;
  bool bVar2;
  LPVOID regionStart;
  SIZE_T SVar3;
  undefined4 *puVar4;
  size_t bytes;
  MEMORY_BASIC_INFORMATION memBasicInfo;
  bool isInRange;
  void *address_local;
  PreReservedVirtualAllocWrapper *this_local;
  
  bVar2 = IsPreReservedRegionPresent(this);
  if (bVar2) {
    regionStart = GetPreReservedStartAddress(this);
    memBasicInfo._47_1_ = IsInRange(regionStart,address);
    if ((bool)memBasicInfo._47_1_) {
      SVar3 = VirtualQuery(address,(PMEMORY_BASIC_INFORMATION)&bytes,0x30);
      if (SVar3 == 0) {
        return false;
      }
      if ((int)memBasicInfo.RegionSize != 0x1000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x97,"(memBasicInfo.State == 0x1000)",
                           "Memory not committed? Checking for uncommitted address region?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    this_local._7_1_ = (bool)(memBasicInfo._47_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
PreReservedVirtualAllocWrapper::IsInRange(void * address)
{
    if (!this->IsPreReservedRegionPresent())
    {
        return false;
    }
    bool isInRange = IsInRange(GetPreReservedStartAddress(), address);
#if DBG
    if (isInRange)
    {
        //Check if the region is in MEM_COMMIT state.
        MEMORY_BASIC_INFORMATION memBasicInfo;
        size_t bytes = VirtualQuery(address, &memBasicInfo, sizeof(memBasicInfo));
        if (bytes == 0)
        {
            return false;
        }
        AssertMsg(memBasicInfo.State == MEM_COMMIT, "Memory not committed? Checking for uncommitted address region?");
    }
#endif
    return isInRange;
}